

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRead.c
# Opt level: O2

int Cudd_addRead(FILE *fp,DdManager *dd,DdNode **E,DdNode ***x,DdNode ***y,DdNode ***xn,
                DdNode ***yn_,int *nx,int *ny,int *m,int *n,int bx,int sx,int by,int sy)

{
  int *piVar1;
  DdNode *T;
  ulong uVar2;
  int iVar3;
  DdNode **ppDVar4;
  DdNode *pDVar5;
  DdNode **ppDVar6;
  DdNode *pDVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  int u;
  int v;
  DdNode **local_88;
  long local_80;
  DdNode **local_78;
  DdNode **local_70;
  long local_68;
  DdNode **local_60;
  DdNode *local_58;
  DdNode **local_50;
  FILE *local_48;
  ulong local_40;
  double val;
  
  T = dd->one;
  pDVar7 = dd->zero;
  local_50 = E;
  local_48 = (FILE *)fp;
  iVar3 = __isoc99_fscanf(fp,"%d %d",&u,&v);
  if (iVar3 != 2) {
    return 0;
  }
  *m = u;
  local_70 = *x;
  ppDVar4 = *xn;
  sVar10 = 0;
  local_80 = 0;
  for (u = u - 1; 0 < u; u = (uint)u >> 1) {
    local_80 = local_80 + 1;
    sVar10 = sVar10 + 8;
  }
  local_88 = (DdNode **)x;
  if (*nx < (int)local_80) {
    if (local_70 == (DdNode **)0x0) {
      local_70 = (DdNode **)malloc(sVar10);
    }
    else {
      local_70 = (DdNode **)realloc(local_70,sVar10);
    }
    *local_88 = (DdNode *)local_70;
    if (local_70 == (DdNode **)0x0) goto LAB_00623102;
    if (*xn == (DdNode **)0x0) {
      ppDVar4 = (DdNode **)malloc(sVar10);
    }
    else {
      ppDVar4 = (DdNode **)realloc(*xn,sVar10);
    }
    *xn = ppDVar4;
    if (ppDVar4 == (DdNode **)0x0) goto LAB_00623102;
  }
  *n = v;
  local_78 = *y;
  local_60 = *yn_;
  sVar10 = 0;
  lVar8 = 0;
  for (v = v - 1; 0 < v; v = (uint)v >> 1) {
    lVar8 = lVar8 + 1;
    sVar10 = sVar10 + 8;
  }
  if ((int)lVar8 <= *ny) {
LAB_0062304b:
    iVar3 = *nx * sx + bx;
    local_88 = ppDVar4;
    local_68 = lVar8;
    for (lVar9 = (long)*nx; ppDVar6 = local_70, lVar9 < local_80; lVar9 = lVar9 + 1) {
      do {
        dd->reordered = 0;
        pDVar5 = cuddUniqueInter(dd,iVar3,T,pDVar7);
        ppDVar4 = local_88;
        ppDVar6[lVar9] = pDVar5;
      } while (dd->reordered == 1);
      if (pDVar5 == (DdNode *)0x0) {
        return 0;
      }
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      do {
        dd->reordered = 0;
        pDVar5 = cuddUniqueInter(dd,iVar3,pDVar7,T);
        ppDVar4[lVar9] = pDVar5;
      } while (dd->reordered == 1);
      if (pDVar5 == (DdNode *)0x0) {
        return 0;
      }
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      iVar3 = iVar3 + sx;
    }
    iVar3 = *ny * sy + by;
    for (lVar8 = (long)*ny; ppDVar6 = local_78, lVar8 < local_68; lVar8 = lVar8 + 1) {
      do {
        dd->reordered = 0;
        pDVar5 = cuddUniqueInter(dd,iVar3,T,pDVar7);
        ppDVar4 = local_60;
        ppDVar6[lVar8] = pDVar5;
      } while (dd->reordered == 1);
      if (pDVar5 == (DdNode *)0x0) {
        return 0;
      }
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      do {
        dd->reordered = 0;
        pDVar5 = cuddUniqueInter(dd,iVar3,pDVar7,T);
        ppDVar4[lVar8] = pDVar5;
      } while (dd->reordered == 1);
      if (pDVar5 == (DdNode *)0x0) {
        return 0;
      }
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      iVar3 = iVar3 + sy;
      ppDVar4 = local_88;
    }
    *nx = (int)local_80;
    *ny = (int)local_68;
    pDVar7 = dd->background;
    *local_50 = pDVar7;
    piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    local_40 = (ulong)T & 0xfffffffffffffffe;
    while( true ) {
      uVar2 = local_40;
      iVar3 = feof(local_48);
      if (iVar3 != 0) {
        return 1;
      }
      iVar3 = __isoc99_fscanf(local_48,"%d %d %lf",&u,&v,&val);
      if (iVar3 != 3) {
        if (iVar3 == -1) {
          return 1;
        }
        return 0;
      }
      if (*m <= u) {
        return 0;
      }
      if (*n <= v) {
        return 0;
      }
      if ((v | u) < 0) {
        return 0;
      }
      *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
      pDVar7 = T;
      for (lVar8 = local_80; lVar9 = local_68, 0 < lVar8; lVar8 = lVar8 + -1) {
        ppDVar6 = local_70;
        if ((u & 1U) == 0) {
          ppDVar6 = ppDVar4;
        }
        pDVar5 = Cudd_addApply(dd,Cudd_addTimes,pDVar7,ppDVar6[lVar8 + -1]);
        if (pDVar5 == (DdNode *)0x0) goto LAB_006233de;
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar7);
        u = u >> 1;
        pDVar7 = pDVar5;
      }
      for (; 0 < lVar9; lVar9 = lVar9 + -1) {
        ppDVar6 = local_78;
        if ((v & 1U) == 0) {
          ppDVar6 = local_60;
        }
        pDVar5 = Cudd_addApply(dd,Cudd_addTimes,pDVar7,ppDVar6[lVar9 + -1]);
        if (pDVar5 == (DdNode *)0x0) goto LAB_006233de;
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar7);
        v = v >> 1;
        pDVar7 = pDVar5;
      }
      pDVar5 = cuddUniqueConst(dd,val);
      ppDVar6 = local_50;
      if (pDVar5 == (DdNode *)0x0) break;
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      local_58 = pDVar5;
      pDVar5 = Cudd_addIte(dd,pDVar7,pDVar5,*local_50);
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar7);
        pDVar7 = local_58;
        break;
      }
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar7);
      Cudd_RecursiveDeref(dd,local_58);
      Cudd_RecursiveDeref(dd,*ppDVar6);
      *ppDVar6 = pDVar5;
    }
LAB_006233de:
    Cudd_RecursiveDeref(dd,pDVar7);
    return 0;
  }
  if (local_78 == (DdNode **)0x0) {
    local_78 = (DdNode **)malloc(sVar10);
  }
  else {
    local_78 = (DdNode **)realloc(local_78,sVar10);
  }
  *y = local_78;
  if (local_78 != (DdNode **)0x0) {
    if (*yn_ == (DdNode **)0x0) {
      local_60 = (DdNode **)malloc(sVar10);
    }
    else {
      local_60 = (DdNode **)realloc(*yn_,sVar10);
    }
    *yn_ = local_60;
    if (local_60 != (DdNode **)0x0) goto LAB_0062304b;
  }
LAB_00623102:
  dd->errorCode = CUDD_MEMORY_OUT;
  return 0;
}

Assistant:

int
Cudd_addRead(
  FILE * fp /* input file pointer */,
  DdManager * dd /* DD manager */,
  DdNode ** E /* characteristic function of the graph */,
  DdNode *** x /* array of row variables */,
  DdNode *** y /* array of column variables */,
  DdNode *** xn /* array of complemented row variables */,
  DdNode *** yn_ /* array of complemented column variables */,
  int * nx /* number or row variables */,
  int * ny /* number or column variables */,
  int * m /* number of rows */,
  int * n /* number of columns */,
  int  bx /* first index of row variables */,
  int  sx /* step of row variables */,
  int  by /* first index of column variables */,
  int  sy /* step of column variables */)
{
    DdNode *one, *zero;
    DdNode *w, *neW;
    DdNode *minterm1;
    int u, v, err, i, nv;
    int lnx, lny;
    CUDD_VALUE_TYPE val;
    DdNode **lx, **ly, **lxn, **lyn;

    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    err = fscanf(fp, "%d %d", &u, &v);
    if (err == EOF) {
        return(0);
    } else if (err != 2) {
        return(0);
    }

    *m = u;
    /* Compute the number of x variables. */
    lx = *x; lxn = *xn;
    u--;        /* row and column numbers start from 0 */
    for (lnx=0; u > 0; lnx++) {
        u >>= 1;
    }
    /* Here we rely on the fact that REALLOC of a null pointer is
    ** translates to an ALLOC.
    */
    if (lnx > *nx) {
        *x = lx = ABC_REALLOC(DdNode *, *x, lnx);
        if (lx == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        *xn = lxn =  ABC_REALLOC(DdNode *, *xn, lnx);
        if (lxn == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    *n = v;
    /* Compute the number of y variables. */
    ly = *y; lyn = *yn_;
    v--;        /* row and column numbers start from 0 */
    for (lny=0; v > 0; lny++) {
        v >>= 1;
    }
    /* Here we rely on the fact that REALLOC of a null pointer is
    ** translates to an ALLOC.
    */
    if (lny > *ny) {
        *y = ly = ABC_REALLOC(DdNode *, *y, lny);
        if (ly == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        *yn_ = lyn =  ABC_REALLOC(DdNode *, *yn_, lny);
        if (lyn == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    /* Create all new variables. */
    for (i = *nx, nv = bx + (*nx) * sx; i < lnx; i++, nv += sx) {
        do {
            dd->reordered = 0;
            lx[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (lx[i] == NULL) return(0);
        cuddRef(lx[i]);
        do {
            dd->reordered = 0;
            lxn[i] = cuddUniqueInter(dd, nv, zero, one);
        } while (dd->reordered == 1);
        if (lxn[i] == NULL) return(0);
        cuddRef(lxn[i]);
    }
    for (i = *ny, nv = by + (*ny) * sy; i < lny; i++, nv += sy) {
        do {
            dd->reordered = 0;
            ly[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (ly[i] == NULL) return(0);
        cuddRef(ly[i]);
        do {
            dd->reordered = 0;
            lyn[i] = cuddUniqueInter(dd, nv, zero, one);
        } while (dd->reordered == 1);
        if (lyn[i] == NULL) return(0);
        cuddRef(lyn[i]);
    }
    *nx = lnx;
    *ny = lny;

    *E = dd->background; /* this call will never cause reordering */
    cuddRef(*E);

    while (! feof(fp)) {
        err = fscanf(fp, "%d %d %lf", &u, &v, &val);
        if (err == EOF) {
            break;
        } else if (err != 3) {
            return(0);
        } else if (u >= *m || v >= *n || u < 0 || v < 0) {
            return(0);
        }
 
        minterm1 = one; cuddRef(minterm1);

        /* Build minterm1 corresponding to this arc */
        for (i = lnx - 1; i>=0; i--) {
            if (u & 1) {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lx[i]);
            } else {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lxn[i]);
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            u >>= 1;
        }
        for (i = lny - 1; i>=0; i--) {
            if (v & 1) {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, ly[i]);
            } else {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lyn[i]);
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            v >>= 1;
        }
        /* Create new constant node if necessary.
        ** This call will never cause reordering.
        */
        neW = cuddUniqueConst(dd, val);
        if (neW == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            return(0);
        }
        cuddRef(neW);

        w = Cudd_addIte(dd, minterm1, neW, *E);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            Cudd_RecursiveDeref(dd, neW);
            return(0);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, minterm1);
        Cudd_RecursiveDeref(dd, neW);
        Cudd_RecursiveDeref(dd, *E);
        *E = w;
    }
    return(1);

}